

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModelHandle.cpp
# Opt level: O3

bool __thiscall
Rml::DataModelConstructor::BindEventCallback
          (DataModelConstructor *this,String *name,DataEventFunc *event_func)

{
  DataModel *this_00;
  _Manager_type p_Var1;
  bool bVar2;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  this_00 = this->model;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = event_func->_M_invoker;
  p_Var1 = (event_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(event_func->super__Function_base)._M_functor;
    local_28._8_8_ = *(undefined8 *)((long)&(event_func->super__Function_base)._M_functor + 8);
    (event_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    event_func->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var1;
  }
  bVar2 = DataModel::BindEventCallback(this_00,name,(DataEventFunc *)&local_28);
  if (local_18 != (_Manager_type)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return bVar2;
}

Assistant:

bool DataModelConstructor::BindEventCallback(const String& name, DataEventFunc event_func)
{
	return model->BindEventCallback(name, std::move(event_func));
}